

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask1_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  
  uVar1 = *in;
  *out = uVar1;
  uVar1 = in[1] * 2 | uVar1;
  *out = uVar1;
  uVar1 = in[2] << 2 | uVar1;
  *out = uVar1;
  uVar1 = in[3] << 3 | uVar1;
  *out = uVar1;
  uVar1 = in[4] << 4 | uVar1;
  *out = uVar1;
  uVar1 = in[5] << 5 | uVar1;
  *out = uVar1;
  uVar1 = in[6] << 6 | uVar1;
  *out = uVar1;
  *out = in[7] << 7 | uVar1;
  return out + 1;
}

Assistant:

uint32_t *__fastpackwithoutmask1_8(const uint32_t *__restrict__ in,
                                   uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 7;
  ++in;

  return out + 1;
}